

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall StatementList::Action(StatementList *this)

{
  compile_errcode cVar1;
  
  while( true ) {
    SymbolQueue::SetCacheLocate(handle_correct_queue);
    cVar1 = Statement::Action(&this->m_statement);
    if (cVar1 != 0) break;
    Statement::LogOutput(&this->m_statement);
  }
  SymbolQueue::SetCurrentLocate(handle_correct_queue);
  return 0;
}

Assistant:

compile_errcode StatementList::Action() {
    int ret = COMPILE_OK;
    while (true) {
        handle_correct_queue->SetCacheLocate();
        if ((ret = m_statement.Action()) == COMPILE_OK) {
            m_statement.LogOutput();
        } else {
            handle_correct_queue->SetCurrentLocate();
            return COMPILE_OK;
        }
    }
}